

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureFunctionTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::sr::anon_unknown_0::TextureSizeInstance::iterate
          (TestStatus *__return_storage_ptr__,TextureSizeInstance *this)

{
  deInt32 *pdVar1;
  vector<de::SharedPtr<vkt::sr::TextureBinding>,_std::allocator<de::SharedPtr<vkt::sr::TextureBinding>_>_>
  *this_00;
  ulong uVar2;
  TestSize *textureSize;
  ostringstream *poVar3;
  TextureFormat TVar4;
  TextureSpec *pTVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  long lVar10;
  bool bVar11;
  uint uVar12;
  long lVar13;
  ulong uVar14;
  int iVar15;
  IVec3 *textureSize_00;
  DataType dataType;
  TextureBindingSp textureBinding;
  IVec4 output;
  stringstream resultSizeStr;
  Vector<int,_2> res;
  value_type local_8f8;
  long local_8e8 [3];
  undefined1 local_8d0 [16];
  undefined1 local_8c0 [16];
  void *local_8b0 [13];
  ios_base local_848 [8];
  ios_base local_840 [264];
  undefined8 local_738 [6];
  undefined4 local_708;
  undefined4 uStack_704;
  undefined4 uStack_700;
  undefined4 uStack_6fc;
  undefined8 local_6f8;
  undefined8 uStack_6f0;
  undefined8 local_6e8;
  undefined8 uStack_6e0;
  undefined8 local_6d8;
  undefined8 uStack_6d0;
  undefined4 local_6c8;
  undefined4 uStack_6c4;
  undefined4 uStack_6c0;
  undefined4 uStack_6bc;
  undefined8 local_6b8;
  undefined8 uStack_6b0;
  undefined8 local_6a8;
  undefined8 uStack_6a0;
  undefined8 local_698;
  undefined8 uStack_690;
  undefined8 local_688;
  undefined8 uStack_680;
  undefined8 local_678;
  undefined8 uStack_670;
  undefined8 local_668;
  undefined8 uStack_660;
  undefined8 local_658;
  undefined8 uStack_650;
  undefined8 local_648;
  undefined8 uStack_640;
  undefined8 local_638;
  undefined8 uStack_630;
  undefined8 local_628;
  undefined8 uStack_620;
  undefined8 local_618;
  undefined8 uStack_610;
  undefined8 local_608;
  undefined8 uStack_600;
  undefined8 local_5f8;
  undefined8 uStack_5f0;
  undefined4 local_5e8;
  undefined4 uStack_5e4;
  undefined4 uStack_5e0;
  undefined4 uStack_5dc;
  undefined8 local_5d8;
  undefined8 uStack_5d0;
  undefined8 local_5c8;
  undefined8 uStack_5c0;
  undefined8 local_5b8;
  undefined8 uStack_5b0;
  undefined8 local_5a8;
  undefined8 uStack_5a0;
  undefined8 local_598;
  undefined8 uStack_590;
  undefined8 local_588;
  undefined8 uStack_580;
  undefined8 local_578;
  undefined8 uStack_570;
  undefined8 local_568;
  undefined8 uStack_560;
  undefined8 local_558;
  undefined8 uStack_550;
  undefined8 local_548;
  undefined8 uStack_540;
  undefined8 local_538;
  undefined8 uStack_530;
  undefined8 local_528;
  undefined8 uStack_520;
  undefined8 local_518;
  undefined8 uStack_510;
  undefined8 local_508;
  undefined8 uStack_500;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  undefined4 local_4e8;
  undefined4 uStack_4e4;
  undefined4 uStack_4e0;
  undefined4 uStack_4dc;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  undefined8 local_498;
  undefined8 uStack_490;
  undefined8 local_488;
  undefined8 uStack_480;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 local_468;
  undefined8 uStack_460;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  undefined8 uStack_420;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 local_408;
  undefined8 uStack_400;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined4 local_3e8;
  undefined4 uStack_3e4;
  undefined4 uStack_3e0;
  undefined4 uStack_3dc;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  undefined4 local_3c8;
  undefined4 uStack_3c4;
  undefined4 uStack_3c0;
  undefined4 uStack_3bc;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined4 local_398;
  undefined4 uStack_394;
  undefined4 uStack_390;
  undefined4 uStack_38c;
  undefined8 local_388;
  undefined8 uStack_380;
  undefined8 local_378;
  undefined8 uStack_370;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined4 local_328;
  undefined4 uStack_324;
  undefined4 uStack_320;
  undefined4 uStack_31c;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined4 local_2d8;
  undefined4 uStack_2d4;
  undefined4 uStack_2d0;
  undefined4 uStack_2cc;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined4 local_288;
  undefined4 uStack_284;
  undefined4 uStack_280;
  undefined4 uStack_27c;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined4 local_1d8;
  undefined4 uStack_1d4;
  undefined4 uStack_1d0;
  undefined4 uStack_1cc;
  undefined4 local_1c8;
  undefined4 uStack_1c4;
  undefined4 uStack_1c0;
  undefined4 uStack_1bc;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  local_738[0] = 0x200000001;
  local_738[1] = 1;
  local_738[2] = 0x100000000;
  local_738[3] = 0x100000002;
  local_738[4] = 0x200000001;
  local_738[5] = 0x100000001;
  local_708 = 0;
  uStack_704 = 1;
  uStack_700 = 1;
  uStack_6fc = 1;
  local_6f8 = 0x300000001;
  uStack_6f0 = 2;
  local_6e8 = 0x100000000;
  uStack_6e0 = 0x200000003;
  local_6d8 = 0x300000001;
  uStack_6d0 = 0x100000002;
  local_6c8 = 0;
  uStack_6c4 = 1;
  uStack_6c0 = 1;
  uStack_6bc = 1;
  local_6b8 = 0x1f00000064;
  uStack_6b0 = 0x12;
  local_6a8 = 0x6400000000;
  uStack_6a0 = 0x120000001f;
  local_698 = 0x1f00000064;
  uStack_690 = 0x100000012;
  local_688 = 0x3200000000;
  uStack_680 = 0x90000000f;
  local_678 = 0x1f00000064;
  uStack_670 = 0x200000012;
  local_668 = 0x1900000000;
  uStack_660 = 0x400000007;
  local_658 = 0x1f00000064;
  uStack_650 = 0x300000012;
  local_648 = 0xc00000000;
  uStack_640 = 0x200000003;
  local_638 = 0x1f00000064;
  uStack_630 = 0x400000012;
  local_628 = 0x600000000;
  uStack_620 = 0x100000001;
  local_618 = 0x1f00000064;
  uStack_610 = 0x500000012;
  local_608 = 0x300000000;
  uStack_600 = 0x100000001;
  local_5f8 = 0x1f00000064;
  uStack_5f0 = 0x600000012;
  local_5e8 = 0;
  uStack_5e4 = 1;
  uStack_5e0 = 1;
  uStack_5dc = 1;
  local_5d8 = 0x8000000064;
  uStack_5d0 = 0x20;
  local_5c8 = 0x6400000000;
  uStack_5c0 = 0x2000000080;
  local_5b8 = 0x8000000064;
  uStack_5b0 = 0x100000020;
  local_5a8 = 0x3200000000;
  uStack_5a0 = 0x1000000040;
  local_598 = 0x8000000064;
  uStack_590 = 0x200000020;
  local_588 = 0x1900000000;
  uStack_580 = 0x800000020;
  local_578 = 0x8000000064;
  uStack_570 = 0x300000020;
  local_568 = 0xc00000000;
  uStack_560 = 0x400000010;
  local_558 = 0x8000000064;
  uStack_550 = 0x400000020;
  local_548 = 0x600000000;
  uStack_540 = 0x200000008;
  local_538 = 0x8000000064;
  uStack_530 = 0x500000020;
  local_528 = 0x300000000;
  uStack_520 = 0x100000004;
  local_518 = 0x8000000064;
  uStack_510 = 0x600000020;
  local_508 = 0x100000000;
  uStack_500 = 0x100000002;
  local_4f8 = 0x8000000064;
  uStack_4f0 = 0x700000020;
  local_4e8 = 0;
  uStack_4e4 = 1;
  uStack_4e0 = 1;
  uStack_4dc = 1;
  local_4d8 = 0x4000000080;
  uStack_4d0 = 0x20;
  local_4c8 = 0x8000000000;
  uStack_4c0 = 0x2000000040;
  local_4b8 = 0x4000000080;
  uStack_4b0 = 0x100000020;
  local_4a8 = 0x4000000000;
  uStack_4a0 = 0x1000000020;
  local_498 = 0x4000000080;
  uStack_490 = 0x200000020;
  local_488 = 0x2000000000;
  uStack_480 = 0x800000010;
  local_478 = 0x4000000080;
  uStack_470 = 0x300000020;
  local_468 = 0x1000000000;
  uStack_460 = 0x400000008;
  local_458 = 0x4000000080;
  uStack_450 = 0x400000020;
  local_448 = 0x800000000;
  uStack_440 = 0x200000004;
  local_438 = 0x4000000080;
  uStack_430 = 0x500000020;
  local_428 = 0x400000000;
  uStack_420 = 0x100000002;
  local_418 = 0x4000000080;
  uStack_410 = 0x600000020;
  local_408 = 0x200000000;
  uStack_400 = 0x100000001;
  local_3f8 = 0x4000000080;
  uStack_3f0 = 0x700000020;
  local_3e8 = 0;
  uStack_3e4 = 1;
  uStack_3e0 = 1;
  uStack_3dc = 1;
  local_3d8 = 0x100000001;
  uStack_3d0 = 1;
  local_3c8 = 0;
  uStack_3c4 = 1;
  uStack_3c0 = 1;
  uStack_3bc = 1;
  local_3b8 = 0x4000000040;
  uStack_3b0 = 0x40;
  local_3a8 = 0x4000000000;
  uStack_3a0 = 0x4000000040;
  local_398 = 0x40;
  uStack_394 = 0x40;
  uStack_390 = 0x40;
  uStack_38c = 1;
  local_388 = 0x2000000000;
  uStack_380 = 0x2000000020;
  local_378 = 0x4000000040;
  uStack_370 = 0x200000040;
  local_368 = 0x1000000000;
  uStack_360 = 0x1000000010;
  local_358 = 0x4000000040;
  uStack_350 = 0x300000040;
  local_348 = 0x800000000;
  uStack_340 = 0x800000008;
  local_338 = 0x4000000040;
  uStack_330 = 0x400000040;
  local_328 = 0;
  uStack_324 = 4;
  uStack_320 = 4;
  uStack_31c = 4;
  local_318 = 0x1f00000064;
  uStack_310 = 0x300000012;
  local_308 = 0x600000001;
  uStack_300 = 0x100000001;
  local_2f8 = 0x4000000080;
  uStack_2f0 = 0x300000020;
  local_2e8 = 0x800000001;
  uStack_2e0 = 0x200000004;
  local_2d8 = 0x40;
  uStack_2d4 = 0x40;
  uStack_2d0 = 0x40;
  uStack_2cc = 1;
  local_2c8 = 0x1000000001;
  uStack_2c0 = 0x1000000010;
  local_2b8 = 0x100000001;
  uStack_2b0 = 6;
  local_2a8 = 0x100000000;
  uStack_2a0 = 0x600000001;
  local_298 = 0x2000000020;
  uStack_290 = 0xc;
  local_288 = 0;
  uStack_284 = 0x20;
  uStack_280 = 0x20;
  uStack_27c = 0xc;
  local_278 = 0x2000000020;
  uStack_270 = 0xc;
  local_268 = 0x1000000001;
  uStack_260 = 0x600000010;
  local_258 = 0x2000000020;
  uStack_250 = 0x10000000c;
  local_248 = 0x1000000000;
  uStack_240 = 0x600000010;
  local_238 = 0x2000000020;
  uStack_230 = 0x20000000c;
  local_228 = 0x800000000;
  uStack_220 = 0x300000008;
  local_218 = 0x2000000020;
  uStack_210 = 0x30000000c;
  local_208 = 0x400000000;
  uStack_200 = 0x100000004;
  local_1f8 = 0x2000000020;
  uStack_1f0 = 0x40000000c;
  local_1e8 = 0x200000000;
  uStack_1e0 = 0x100000002;
  local_1d8 = 0x20;
  uStack_1d4 = 0x20;
  uStack_1d0 = 0xc;
  uStack_1cc = 5;
  local_1c8 = 0;
  uStack_1c4 = 1;
  uStack_1c0 = 1;
  uStack_1bc = 1;
  lVar13 = (long)this->m_iterationCounter;
  iVar15 = this->m_iterationCounter + 1;
  this->m_iterationCounter = iVar15;
  if (iVar15 == 0x2d) {
    local_8c0._0_8_ = local_8b0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_8c0,"Pass","");
    __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_description,local_8c0._0_8_,
               (long)(_func_int ***)local_8c0._8_8_ + local_8c0._0_8_);
LAB_0063944b:
    if ((void **)local_8c0._0_8_ != local_8b0) {
      operator_delete((void *)local_8c0._0_8_,(long)local_8b0[0] + 1);
    }
  }
  else {
    textureSize = &this->m_testSize;
    uVar6 = local_738[lVar13 * 4];
    uVar7 = local_738[lVar13 * 4 + 1];
    uVar8 = local_738[lVar13 * 4 + 2];
    uVar9 = local_738[lVar13 * 4 + 3];
    (this->m_testSize).lodBase = (int)uVar8;
    (this->m_testSize).expectedSize.m_data[0] = (int)((ulong)uVar8 >> 0x20);
    *(undefined8 *)((this->m_testSize).expectedSize.m_data + 1) = uVar9;
    *(undefined8 *)(this->m_testSize).textureSize.m_data = uVar6;
    *(undefined8 *)((this->m_testSize).textureSize.m_data + 2) = uVar7;
    TVar4 = (TextureFormat)
            ((this->super_TextureQueryInstance).super_ShaderRenderCaseInstance.super_TestInstance.
            m_context)->m_testCtx->m_log;
    iVar15 = (this->m_testSize).lod;
    uVar12 = (this->m_testSize).lodBase;
    textureSize_00 = (IVec3 *)(ulong)uVar12;
    bVar11 = isValidCase(((this->super_TextureQueryInstance).m_textureSpec)->type,
                         &textureSize->textureSize,iVar15,uVar12);
    if (bVar11) {
      local_8f8.m_ptr = (TextureBinding *)0x0;
      local_8f8.m_state = (SharedPtrStateBase *)0x0;
      poVar3 = (ostringstream *)(local_8c0 + 8);
      local_8c0._0_8_ = TVar4;
      std::__cxx11::ostringstream::ostringstream(poVar3);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar3,"Testing image size ",0x13);
      sr::(anonymous_namespace)::getTextureSizeString_abi_cxx11_
                ((string *)local_1b0,
                 (_anonymous_namespace_ *)
                 (ulong)((this->super_TextureQueryInstance).m_textureSpec)->type,
                 (TextureType)textureSize,textureSize_00);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar3,(char *)local_1b0._0_8_,
                 CONCAT44(local_1b0._12_4_,local_1b0._8_4_));
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_8c0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      if (local_1b0._0_8_ != (long)local_1b0 + 0x10) {
        operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
      }
      std::__cxx11::ostringstream::~ostringstream(poVar3);
      std::ios_base::~ios_base(local_848);
      poVar3 = (ostringstream *)(local_8c0 + 8);
      local_8c0._0_8_ = TVar4;
      std::__cxx11::ostringstream::ostringstream(poVar3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"Lod: ",5);
      std::ostream::operator<<(poVar3,(this->m_testSize).lod);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,", base level: ",0xe);
      std::ostream::operator<<(poVar3,(this->m_testSize).lodBase);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_8c0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar3);
      std::ios_base::~ios_base(local_848);
      switch(((this->super_TextureQueryInstance).m_textureSpec)->type) {
      case TEXTURETYPE_1D:
        poVar3 = (ostringstream *)(local_8c0 + 8);
        local_8c0._0_8_ = TVar4;
        std::__cxx11::ostringstream::ostringstream(poVar3);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"Expecting: ",0xb);
        std::ostream::operator<<(poVar3,(this->m_testSize).expectedSize.m_data[0]);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_8c0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        break;
      case TEXTURETYPE_2D:
        poVar3 = (ostringstream *)(local_8c0 + 8);
        local_8c0._0_8_ = TVar4;
        std::__cxx11::ostringstream::ostringstream(poVar3);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"Expecting: ",0xb);
        std::ostream::operator<<(poVar3,(this->m_testSize).expectedSize.m_data[0]);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"x",1);
        std::ostream::operator<<(poVar3,(this->m_testSize).expectedSize.m_data[1]);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_8c0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        break;
      case TEXTURETYPE_3D:
        poVar3 = (ostringstream *)(local_8c0 + 8);
        local_8c0._0_8_ = TVar4;
        std::__cxx11::ostringstream::ostringstream(poVar3);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"Expecting: ",0xb);
        std::ostream::operator<<(poVar3,(this->m_testSize).expectedSize.m_data[0]);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"x",1);
        std::ostream::operator<<(poVar3,(this->m_testSize).expectedSize.m_data[1]);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"x",1);
        std::ostream::operator<<(poVar3,(this->m_testSize).expectedSize.m_data[2]);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_8c0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        break;
      case TEXTURETYPE_CUBE_MAP:
        poVar3 = (ostringstream *)(local_8c0 + 8);
        local_8c0._0_8_ = TVar4;
        std::__cxx11::ostringstream::ostringstream(poVar3);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"Expecting: ",0xb);
        std::ostream::operator<<(poVar3,(this->m_testSize).expectedSize.m_data[0]);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"x",1);
        std::ostream::operator<<(poVar3,(this->m_testSize).expectedSize.m_data[1]);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_8c0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        break;
      case TEXTURETYPE_1D_ARRAY:
        poVar3 = (ostringstream *)(local_8c0 + 8);
        local_8c0._0_8_ = TVar4;
        std::__cxx11::ostringstream::ostringstream(poVar3);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"Expecting: ",0xb);
        std::ostream::operator<<(poVar3,(this->m_testSize).expectedSize.m_data[0]);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," and ",5);
        std::ostream::operator<<(poVar3,(this->m_testSize).textureSize.m_data[2]);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," layer(s)",9);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_8c0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        break;
      case TEXTURETYPE_2D_ARRAY:
        poVar3 = (ostringstream *)(local_8c0 + 8);
        local_8c0._0_8_ = TVar4;
        std::__cxx11::ostringstream::ostringstream(poVar3);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"Expecting: ",0xb);
        std::ostream::operator<<(poVar3,(this->m_testSize).expectedSize.m_data[0]);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"x",1);
        std::ostream::operator<<(poVar3,(this->m_testSize).expectedSize.m_data[1]);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," and ",5);
        std::ostream::operator<<(poVar3,(this->m_testSize).textureSize.m_data[2]);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," layer(s)",9);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_8c0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        break;
      case TEXTURETYPE_CUBE_ARRAY:
        poVar3 = (ostringstream *)(local_8c0 + 8);
        local_8c0._0_8_ = TVar4;
        std::__cxx11::ostringstream::ostringstream(poVar3);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"Expecting: ",0xb);
        std::ostream::operator<<(poVar3,(this->m_testSize).expectedSize.m_data[0]);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"x",1);
        std::ostream::operator<<(poVar3,(this->m_testSize).expectedSize.m_data[1]);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," and ",5);
        std::ostream::operator<<(poVar3,(this->m_testSize).textureSize.m_data[2] / 6);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," cube(s)",8);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_8c0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        break;
      default:
        goto switchD_00639630_default;
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_8c0 + 8));
      std::ios_base::~ios_base(local_848);
switchD_00639630_default:
      pTVar5 = (this->super_TextureQueryInstance).m_textureSpec;
      createEmptyTexture((anon_unknown_0 *)local_8c0,pTVar5->format,pTVar5->type,
                         &textureSize->textureSize,iVar15 + uVar12 + 1,(this->m_testSize).lodBase,
                         &pTVar5->sampler);
      if (local_8f8.m_state == (SharedPtrStateBase *)local_8c0._8_8_) {
LAB_00639aa0:
        if ((SharedPtrStateBase *)local_8c0._8_8_ != (SharedPtrStateBase *)0x0) {
          LOCK();
          pdVar1 = (deInt32 *)(local_8c0._8_8_ + 8);
          *pdVar1 = *pdVar1 + -1;
          UNLOCK();
          if (*pdVar1 == 0) {
            local_8c0._0_4_ = R;
            local_8c0._4_4_ = SNORM_INT8;
            (*(*(_func_int ***)local_8c0._8_8_)[2])();
          }
          LOCK();
          pdVar1 = (deInt32 *)(local_8c0._8_8_ + 0xc);
          *pdVar1 = *pdVar1 + -1;
          UNLOCK();
          if ((*pdVar1 == 0) && ((SharedPtrStateBase *)local_8c0._8_8_ != (SharedPtrStateBase *)0x0)
             ) {
            (*(*(_func_int ***)local_8c0._8_8_)[1])();
          }
        }
      }
      else {
        if (local_8f8.m_state != (SharedPtrStateBase *)0x0) {
          LOCK();
          pdVar1 = &(local_8f8.m_state)->strongRefCount;
          *pdVar1 = *pdVar1 + -1;
          UNLOCK();
          if (*pdVar1 == 0) {
            local_8f8.m_ptr = (TextureBinding *)0x0;
            (*(local_8f8.m_state)->_vptr_SharedPtrStateBase[2])();
          }
          LOCK();
          pdVar1 = &(local_8f8.m_state)->weakRefCount;
          *pdVar1 = *pdVar1 + -1;
          UNLOCK();
          if ((*pdVar1 == 0) && (local_8f8.m_state != (SharedPtrStateBase *)0x0)) {
            (*(local_8f8.m_state)->_vptr_SharedPtrStateBase[1])();
          }
        }
        local_8f8.m_ptr = (TextureBinding *)local_8c0._0_8_;
        local_8f8.m_state = (SharedPtrStateBase *)local_8c0._8_8_;
        if ((SharedPtrStateBase *)local_8c0._8_8_ != (SharedPtrStateBase *)0x0) {
          LOCK();
          *(deInt32 *)(local_8c0._8_8_ + 8) = *(deInt32 *)(local_8c0._8_8_ + 8) + 1;
          UNLOCK();
          LOCK();
          *(deInt32 *)(local_8c0._8_8_ + 0xc) = *(deInt32 *)(local_8c0._8_8_ + 0xc) + 1;
          UNLOCK();
          goto LAB_00639aa0;
        }
      }
      this_00 = &(this->super_TextureQueryInstance).super_ShaderRenderCaseInstance.m_textures;
      std::
      vector<de::SharedPtr<vkt::sr::TextureBinding>,_std::allocator<de::SharedPtr<vkt::sr::TextureBinding>_>_>
      ::_M_erase_at_end(this_00,(this->super_TextureQueryInstance).super_ShaderRenderCaseInstance.
                                m_textures.
                                super__Vector_base<de::SharedPtr<vkt::sr::TextureBinding>,_std::allocator<de::SharedPtr<vkt::sr::TextureBinding>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
      std::
      vector<de::SharedPtr<vkt::sr::TextureBinding>,_std::allocator<de::SharedPtr<vkt::sr::TextureBinding>_>_>
      ::push_back(this_00,&local_8f8);
      if (local_8f8.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar1 = &(local_8f8.m_state)->strongRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          local_8f8.m_ptr = (TextureBinding *)0x0;
          (*(local_8f8.m_state)->_vptr_SharedPtrStateBase[2])();
        }
        LOCK();
        pdVar1 = &(local_8f8.m_state)->weakRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if ((*pdVar1 == 0) && (local_8f8.m_state != (SharedPtrStateBase *)0x0)) {
          (*(local_8f8.m_state)->_vptr_SharedPtrStateBase[1])();
        }
      }
      switch(((this->super_TextureQueryInstance).m_textureSpec)->type) {
      case TEXTURETYPE_1D:
      case TEXTURETYPE_2D:
      case TEXTURETYPE_3D:
      case TEXTURETYPE_CUBE_MAP:
        (this->m_expectedSize).m_data[2] = (this->m_testSize).expectedSize.m_data[2];
        *(undefined8 *)(this->m_expectedSize).m_data =
             *(undefined8 *)(this->m_testSize).expectedSize.m_data;
        break;
      case TEXTURETYPE_1D_ARRAY:
        iVar15 = (this->m_testSize).textureSize.m_data[2];
        (this->m_expectedSize).m_data[0] = (this->m_testSize).expectedSize.m_data[0];
        (this->m_expectedSize).m_data[1] = iVar15;
        (this->m_expectedSize).m_data[2] = 0;
        break;
      case TEXTURETYPE_2D_ARRAY:
        iVar15 = (this->m_testSize).textureSize.m_data[2];
        *(undefined8 *)(this->m_expectedSize).m_data =
             *(undefined8 *)(this->m_testSize).expectedSize.m_data;
        (this->m_expectedSize).m_data[2] = iVar15;
        break;
      case TEXTURETYPE_CUBE_ARRAY:
        iVar15 = (this->m_testSize).textureSize.m_data[2];
        *(undefined8 *)(this->m_expectedSize).m_data =
             *(undefined8 *)(this->m_testSize).expectedSize.m_data;
        (this->m_expectedSize).m_data[2] = iVar15 / 6;
      }
      TextureQueryInstance::render(&this->super_TextureQueryInstance);
      tcu::TextureLevel::getAccess
                ((ConstPixelBufferAccess *)local_8c0,
                 &(this->super_TextureQueryInstance).super_ShaderRenderCaseInstance.m_resultImage);
      tcu::ConstPixelBufferAccess::getPixelInt
                ((ConstPixelBufferAccess *)local_8d0,(int)(ConstPixelBufferAccess *)local_8c0,0,0);
      uVar14 = (ulong)((this->super_TextureQueryInstance).m_textureSpec)->type;
      dataType = TYPE_LAST;
      if (uVar14 < 7) {
        dataType = *(DataType *)(&DAT_00b26b7c + uVar14 * 4);
      }
      uVar12 = glu::getDataTypeScalarSize(dataType);
      if ((int)uVar12 < 1) {
LAB_00639c06:
        poVar3 = (ostringstream *)(local_8c0 + 8);
        local_8c0._0_8_ = TVar4;
        std::__cxx11::ostringstream::ostringstream(poVar3);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"Passed",6);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_8c0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar3);
        std::ios_base::~ios_base(local_848);
        bVar11 = true;
      }
      else {
        if (local_8d0._0_4_ == (this->m_expectedSize).m_data[0]) {
          uVar14 = 0;
          do {
            if ((ulong)uVar12 - 1 == uVar14) goto LAB_00639c06;
            lVar13 = uVar14 * 4;
            uVar2 = uVar14 + 1;
            lVar10 = uVar14 + 1;
            uVar14 = uVar2;
          } while (*(int *)(local_8d0 + lVar13 + 4) == (this->m_expectedSize).m_data[lVar10]);
          bVar11 = uVar12 <= uVar2;
        }
        else {
          bVar11 = false;
        }
        std::__cxx11::stringstream::stringstream((stringstream *)local_8c0);
        if (uVar12 == 3) {
          local_1b0._8_4_ = local_8d0._8_4_;
          tcu::operator<<((ostream *)local_8b0,(Vector<int,_3> *)local_1b0);
        }
        else if (uVar12 == 2) {
          tcu::operator<<((ostream *)local_8b0,(Vector<int,_2> *)local_1b0);
        }
        else if (uVar12 == 1) {
          std::ostream::operator<<(local_8b0,local_8d0._0_4_);
        }
        poVar3 = (ostringstream *)(local_1b0 + 8);
        local_1b0._0_8_ = TVar4;
        std::__cxx11::ostringstream::ostringstream(poVar3);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"Result: ",8);
        std::__cxx11::stringbuf::str();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar3,(char *)local_8f8.m_ptr,(long)local_8f8.m_state);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        if (local_8f8.m_ptr != (TextureBinding *)local_8e8) {
          operator_delete(local_8f8.m_ptr,local_8e8[0] + 1);
        }
        std::__cxx11::ostringstream::~ostringstream(poVar3);
        std::ios_base::~ios_base(local_138);
        poVar3 = (ostringstream *)(local_1b0 + 8);
        local_1b0._0_8_ = TVar4;
        std::__cxx11::ostringstream::ostringstream(poVar3);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"Failed",6);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar3);
        std::ios_base::~ios_base(local_138);
        std::__cxx11::stringstream::~stringstream((stringstream *)local_8c0);
        std::ios_base::~ios_base(local_840);
      }
      local_8c0._0_8_ = TVar4;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_8c0 + 8));
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_8c0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_8c0 + 8));
      std::ios_base::~ios_base(local_848);
      if (!bVar11) {
        local_8c0._0_8_ = local_8b0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_8c0,"Got unexpected result","");
        __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
        (__return_storage_ptr__->m_description)._M_dataplus._M_p =
             (pointer)&(__return_storage_ptr__->m_description).field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&__return_storage_ptr__->m_description,local_8c0._0_8_,
                   (long)(_func_int ***)local_8c0._8_8_ + local_8c0._0_8_);
        goto LAB_0063944b;
      }
    }
    tcu::TestStatus::incomplete();
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus TextureSizeInstance::iterate (void)
{
	const TestSize testSizes[] =
	{
		{ tcu::IVec3(1, 2, 1),			0,		0,	tcu::IVec3(1, 2, 1)			},
		{ tcu::IVec3(1, 2, 1),			1,		0,	tcu::IVec3(1, 1, 1)			},

		{ tcu::IVec3(1, 3, 2),			0,		0,	tcu::IVec3(1, 3, 2)			},
		{ tcu::IVec3(1, 3, 2),			1,		0,	tcu::IVec3(1, 1, 1)			},

		{ tcu::IVec3(100, 31, 18),		0,		0,	tcu::IVec3(100, 31, 18)		},
		{ tcu::IVec3(100, 31, 18),		1,		0,	tcu::IVec3(50, 15, 9)		},
		{ tcu::IVec3(100, 31, 18),		2,		0,	tcu::IVec3(25, 7, 4)		},
		{ tcu::IVec3(100, 31, 18),		3,		0,	tcu::IVec3(12, 3, 2)		},
		{ tcu::IVec3(100, 31, 18),		4,		0,	tcu::IVec3(6, 1, 1)			},
		{ tcu::IVec3(100, 31, 18),		5,		0,	tcu::IVec3(3, 1, 1)			},
		{ tcu::IVec3(100, 31, 18),		6,		0,	tcu::IVec3(1, 1, 1)			},

		{ tcu::IVec3(100, 128, 32),		0,		0,	tcu::IVec3(100, 128, 32)	},
		{ tcu::IVec3(100, 128, 32),		1,		0,	tcu::IVec3(50, 64, 16)		},
		{ tcu::IVec3(100, 128, 32),		2,		0,	tcu::IVec3(25, 32, 8)		},
		{ tcu::IVec3(100, 128, 32),		3,		0,	tcu::IVec3(12, 16, 4)		},
		{ tcu::IVec3(100, 128, 32),		4,		0,	tcu::IVec3(6, 8, 2)			},
		{ tcu::IVec3(100, 128, 32),		5,		0,	tcu::IVec3(3, 4, 1)			},
		{ tcu::IVec3(100, 128, 32),		6,		0,	tcu::IVec3(1, 2, 1)			},
		{ tcu::IVec3(100, 128, 32),		7,		0,	tcu::IVec3(1, 1, 1)			},

		// pow 2
		{ tcu::IVec3(128, 64, 32),		0,		0,	tcu::IVec3(128, 64, 32)		},
		{ tcu::IVec3(128, 64, 32),		1,		0,	tcu::IVec3(64, 32, 16)		},
		{ tcu::IVec3(128, 64, 32),		2,		0,	tcu::IVec3(32, 16, 8)		},
		{ tcu::IVec3(128, 64, 32),		3,		0,	tcu::IVec3(16, 8, 4)		},
		{ tcu::IVec3(128, 64, 32),		4,		0,	tcu::IVec3(8, 4, 2)			},
		{ tcu::IVec3(128, 64, 32),		5,		0,	tcu::IVec3(4, 2, 1)			},
		{ tcu::IVec3(128, 64, 32),		6,		0,	tcu::IVec3(2, 1, 1)			},
		{ tcu::IVec3(128, 64, 32),		7,		0,	tcu::IVec3(1, 1, 1)			},

		// w == h
		{ tcu::IVec3(1, 1, 1),			0,		0,	tcu::IVec3(1, 1, 1)			},
		{ tcu::IVec3(64, 64, 64),		0,		0,	tcu::IVec3(64, 64, 64)		},
		{ tcu::IVec3(64, 64, 64),		1,		0,	tcu::IVec3(32, 32, 32)		},
		{ tcu::IVec3(64, 64, 64),		2,		0,	tcu::IVec3(16, 16, 16)		},
		{ tcu::IVec3(64, 64, 64),		3,		0,	tcu::IVec3(8, 8, 8)			},
		{ tcu::IVec3(64, 64, 64),		4,		0,	tcu::IVec3(4, 4, 4)			},

		// with lod base
		{ tcu::IVec3(100, 31, 18),		3,		1,	tcu::IVec3(6, 1, 1)			},
		{ tcu::IVec3(128, 64, 32),		3,		1,	tcu::IVec3(8, 4, 2)			},
		{ tcu::IVec3(64, 64, 64),		1,		1,	tcu::IVec3(16, 16, 16)		},

		// w == h and d % 6 == 0 (for cube array)
		{ tcu::IVec3(1, 1, 6),			0,		0,	tcu::IVec3(1, 1, 6)			},
		{ tcu::IVec3(32, 32, 12),		0,		0,	tcu::IVec3(32, 32, 12)		},
		{ tcu::IVec3(32, 32, 12),		0,		1,	tcu::IVec3(16, 16, 6)		},
		{ tcu::IVec3(32, 32, 12),		1,		0,	tcu::IVec3(16, 16, 6)		},
		{ tcu::IVec3(32, 32, 12),		2,		0,	tcu::IVec3(8, 8, 3)			},
		{ tcu::IVec3(32, 32, 12),		3,		0,	tcu::IVec3(4, 4, 1)			},
		{ tcu::IVec3(32, 32, 12),		4,		0,	tcu::IVec3(2, 2, 1)			},
		{ tcu::IVec3(32, 32, 12),		5,		0,	tcu::IVec3(1, 1, 1)			},
	};
	const int lastIterationIndex = DE_LENGTH_OF_ARRAY(testSizes) + 1;

	m_iterationCounter++;

	if (m_iterationCounter == lastIterationIndex)
		return tcu::TestStatus::pass("Pass");
	else
	{
		// set current test size
		m_testSize = testSizes[m_iterationCounter - 1];

		if (!testTextureSize())
			return tcu::TestStatus::fail("Got unexpected result");

		return tcu::TestStatus::incomplete();
	}
}